

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_table_entry.cpp
# Opt level: O2

void __thiscall duckdb::DuckTableEntry::CommitAlter(DuckTableEntry *this,string *column_name)

{
  ColumnList *this_00;
  __type _Var1;
  bool bVar2;
  ColumnDefinition *this_01;
  string *__lhs;
  column_t *pcVar3;
  LogicalIndex logical;
  PhysicalIndex column_index;
  DataTable *this_02;
  ColumnListIterator CVar4;
  ColumnLogicalIteratorInternal __begin1;
  ColumnLogicalIteratorInternal __end1;
  optional_idx local_80;
  ColumnLogicalIteratorInternal local_78;
  ColumnLogicalIteratorInternal local_58;
  ColumnListIterator local_38;
  
  local_80.index = 0xffffffffffffffff;
  this_00 = &(this->super_TableCatalogEntry).columns;
  CVar4 = ColumnList::Logical(this_00);
  local_38.list = CVar4.list;
  local_38.physical = CVar4.physical;
  ColumnList::ColumnListIterator::begin(&local_78,&local_38);
  ColumnList::ColumnListIterator::end(&local_58,&local_38);
  while( true ) {
    if (((local_78.pos == local_58.pos) && (local_78.end == local_58.end)) &&
       (local_78.list == local_58.list)) goto LAB_018cf588;
    this_01 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*(&local_78);
    __lhs = ColumnDefinition::Name_abi_cxx11_(this_01);
    _Var1 = ::std::operator==(__lhs,column_name);
    if (_Var1) break;
    local_78.pos = local_78.pos + 1;
  }
  bVar2 = ColumnDefinition::Generated(this_01);
  if (!bVar2) {
    pcVar3 = ColumnDefinition::Oid(this_01);
    optional_idx::optional_idx(&local_80,*pcVar3);
LAB_018cf588:
    logical.index = optional_idx::GetIndex(&local_80);
    column_index = ColumnList::LogicalToPhysical(this_00,logical);
    this_02 = shared_ptr<duckdb::DataTable,_true>::operator->(&this->storage);
    DataTable::CommitDropColumn(this_02,column_index.index);
  }
  return;
}

Assistant:

void DuckTableEntry::CommitAlter(string &column_name) {
	D_ASSERT(!column_name.empty());
	optional_idx removed_index;
	for (auto &col : columns.Logical()) {
		if (col.Name() == column_name) {
			// No need to alter storage, removed column is generated column
			if (col.Generated()) {
				return;
			}
			removed_index = col.Oid();
			break;
		}
	}

	auto logical_column_index = LogicalIndex(removed_index.GetIndex());
	auto column_index = columns.LogicalToPhysical(logical_column_index).index;
	storage->CommitDropColumn(column_index);
}